

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O1

void __thiscall wasm::StackIROptimizer::removeAt(StackIROptimizer *this,Index i)

{
  StackInst *pSVar1;
  Expression *pEVar2;
  ulong uVar3;
  uint uVar4;
  pointer ppSVar5;
  
  ppSVar5 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = ppSVar5[i];
  ppSVar5[i] = (StackInst *)0x0;
  if (pSVar1->op == Basic) {
    return;
  }
  uVar3 = (ulong)(i + 1);
  ppSVar5 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->insts->
                            super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3)) {
    pEVar2 = pSVar1->origin;
    uVar4 = i + 2;
    do {
      pSVar1 = ppSVar5[uVar3];
      ppSVar5[uVar3] = (StackInst *)0x0;
      if ((((pSVar1 != (StackInst *)0x0) && (pSVar1->origin == pEVar2)) &&
          (pSVar1->op < (TryTableEnd|BlockBegin))) && ((0x58a4U >> (pSVar1->op & 0x1f) & 1) != 0)) {
        return;
      }
      uVar3 = (ulong)uVar4;
      ppSVar5 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar3 < (ulong)((long)(this->insts->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5 >> 3)
            );
  }
  __assert_fail("i < insts.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                ,0x172,"void wasm::StackIROptimizer::removeAt(Index)");
}

Assistant:

void StackIROptimizer::removeAt(Index i) {
  auto* inst = insts[i];
  insts[i] = nullptr;
  if (inst->op == StackInst::Basic) {
    return; // that was it
  }
  auto* origin = inst->origin;
  while (1) {
    i++;
    assert(i < insts.size());
    inst = insts[i];
    insts[i] = nullptr;
    if (inst && inst->origin == origin && isControlFlowEnd(inst)) {
      return; // that's it, we removed it all
    }
  }
}